

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextVkImpl::DvpLogRenderPass_PSOMismatch(DeviceContextVkImpl *this)

{
  PipelineStateVkImpl *this_00;
  TextureViewVkImpl *pTVar1;
  int iVar2;
  int iVar3;
  GraphicsPipelineDesc *pGVar4;
  ostream *poVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TextureFormatAttribs *pTVar6;
  undefined4 extraout_var_01;
  char (*in_RCX) [93];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args;
  Uint32 rt_1;
  Uint32 rt;
  ulong uVar7;
  string msg;
  Diligent local_1d8 [32];
  stringstream ss;
  ostream local_1a8 [376];
  
  this_00 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
            super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pPipelineState.m_pObject;
  PipelineStateBase<Diligent::EngineVkImplTraits>::CheckPipelineReady
            (&this_00->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
  pGVar4 = PipelineStateBase<Diligent::EngineVkImplTraits>::GetGraphicsPipelineDesc
                     (&((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                        super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pPipelineState.
                       m_pObject)->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar5 = std::operator<<(local_1a8,"Active render pass is incompatible with PSO \'");
  poVar5 = std::operator<<(poVar5,(this_00->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
                                  super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                                  .m_Desc.super_DeviceObjectAttribs.Name);
  poVar5 = std::operator<<(poVar5,
                           "\'. This indicates the mismatch between the number and/or format of bound render targets and/or depth stencil buffer and the PSO. Vulkan requires exact match.\n    Bound render targets ("
                          );
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::operator<<(poVar5,"):");
  iVar3 = 0;
  for (uVar7 = 0;
      uVar7 < (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
              super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_NumBoundRenderTargets;
      uVar7 = uVar7 + 1) {
    std::operator<<(local_1a8,' ');
    pTVar1 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
             super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundRenderTargets[uVar7].
             m_pObject;
    if (pTVar1 == (TextureViewVkImpl *)0x0) {
      std::operator<<(local_1a8,"<Not set>");
    }
    else {
      if (iVar3 != 0) {
        iVar2 = (*(((pTVar1->super_TextureViewBase<Diligent::EngineVkImplTraits>).m_pTexture)->
                  super_IDeviceObject).super_IObject._vptr_IObject[4])();
        if (iVar3 != *(int *)(CONCAT44(extraout_var,iVar2) + 0x20)) {
          FormatString<char[26],char[77]>
                    (&msg,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])
                     "SampleCount == 0 || SampleCount == pRTV->GetTexture()->GetDesc().SampleCount",
                     (char (*) [77])in_RCX);
          in_RCX = (char (*) [93])0x2b1;
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"DvpLogRenderPass_PSOMismatch",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                     ,0x2b1);
          std::__cxx11::string::~string((string *)&msg);
        }
      }
      iVar3 = (*(((pTVar1->super_TextureViewBase<Diligent::EngineVkImplTraits>).m_pTexture)->
                super_IDeviceObject).super_IObject._vptr_IObject[4])();
      iVar3 = *(int *)(CONCAT44(extraout_var_00,iVar3) + 0x20);
      pTVar6 = GetTextureFormatAttribs
                         ((pTVar1->super_TextureViewBase<Diligent::EngineVkImplTraits>).
                          super_DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
                          .m_Desc.Format);
      std::operator<<(local_1a8,pTVar6->Name);
    }
  }
  std::operator<<(local_1a8,"; DSV: ");
  pTVar1 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
           super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundDepthStencil.m_pObject;
  if (pTVar1 == (TextureViewVkImpl *)0x0) {
    std::operator<<(local_1a8,"<Not set>");
  }
  else {
    if (iVar3 != 0) {
      iVar2 = (*(((pTVar1->super_TextureViewBase<Diligent::EngineVkImplTraits>).m_pTexture)->
                super_IDeviceObject).super_IObject._vptr_IObject[4])();
      if (iVar3 != *(int *)(CONCAT44(extraout_var_01,iVar2) + 0x20)) {
        FormatString<char[26],char[93]>
                  (&msg,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])
                   "SampleCount == 0 || SampleCount == m_pBoundDepthStencil->GetTexture()->GetDesc().SampleCount"
                   ,in_RCX);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"DvpLogRenderPass_PSOMismatch",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,699);
        std::__cxx11::string::~string((string *)&msg);
      }
    }
    (*(((((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
          super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundDepthStencil.m_pObject)->
        super_TextureViewBase<Diligent::EngineVkImplTraits>).m_pTexture)->super_IDeviceObject).
      super_IObject._vptr_IObject[4])();
    pTVar6 = GetTextureFormatAttribs
                       ((((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                          super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundDepthStencil
                         .m_pObject)->super_TextureViewBase<Diligent::EngineVkImplTraits>).
                        super_DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
                        .m_Desc.Format);
    std::operator<<(local_1a8,pTVar6->Name);
    if ((((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
          super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundDepthStencil.m_pObject)->
        super_TextureViewBase<Diligent::EngineVkImplTraits>).
        super_DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
        .m_Desc.ViewType == TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL) {
      std::operator<<(local_1a8," (read-only)");
    }
  }
  poVar5 = std::operator<<(local_1a8,"; Sample count: ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  if ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundShadingRateMap.m_pObject !=
      (ITextureView *)0x0) {
    std::operator<<(local_1a8,"; VRS");
  }
  poVar5 = std::operator<<(local_1a8,"\n    PSO: render targets (");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::operator<<(poVar5,"): ");
  for (uVar7 = 0; uVar7 < pGVar4->NumRenderTargets; uVar7 = uVar7 + 1) {
    poVar5 = std::operator<<(local_1a8,' ');
    pTVar6 = GetTextureFormatAttribs(pGVar4->RTVFormats[uVar7]);
    std::operator<<(poVar5,pTVar6->Name);
  }
  poVar5 = std::operator<<(local_1a8,"; DSV: ");
  pTVar6 = GetTextureFormatAttribs(pGVar4->DSVFormat);
  std::operator<<(poVar5,pTVar6->Name);
  if (pGVar4->ReadOnlyDSV == true) {
    std::operator<<(local_1a8," (read-only)");
  }
  poVar5 = std::operator<<(local_1a8,"; Sample count: ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  if ((pGVar4->ShadingRateFlags & PIPELINE_SHADING_RATE_FLAG_LAST) !=
      PIPELINE_SHADING_RATE_FLAG_NONE) {
    std::operator<<(local_1a8,"; VRS");
  }
  std::__cxx11::stringbuf::str();
  FormatString<std::__cxx11::string>(&msg,local_1d8,Args);
  std::__cxx11::string::~string((string *)local_1d8);
  if (DebugMessageCallback != (undefined *)0x0) {
    (*(code *)DebugMessageCallback)(2,msg._M_dataplus._M_p,0,0,0);
  }
  std::__cxx11::string::~string((string *)&msg);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return;
}

Assistant:

void DeviceContextVkImpl::DvpLogRenderPass_PSOMismatch()
{
    const PipelineStateDesc&    Desc       = m_pPipelineState->GetDesc();
    const GraphicsPipelineDesc& GrPipeline = m_pPipelineState->GetGraphicsPipelineDesc();

    std::stringstream ss;
    ss << "Active render pass is incompatible with PSO '" << Desc.Name
       << "'. This indicates the mismatch between the number and/or format of bound render "
          "targets and/or depth stencil buffer and the PSO. Vulkan requires exact match.\n"
          "    Bound render targets ("
       << m_NumBoundRenderTargets << "):";
    Uint32 SampleCount = 0;
    for (Uint32 rt = 0; rt < m_NumBoundRenderTargets; ++rt)
    {
        ss << ' ';
        if (TextureViewVkImpl* pRTV = m_pBoundRenderTargets[rt])
        {
            VERIFY_EXPR(SampleCount == 0 || SampleCount == pRTV->GetTexture()->GetDesc().SampleCount);
            SampleCount = pRTV->GetTexture()->GetDesc().SampleCount;
            ss << GetTextureFormatAttribs(pRTV->GetDesc().Format).Name;
        }
        else
            ss << "<Not set>";
    }
    ss << "; DSV: ";
    if (m_pBoundDepthStencil)
    {
        VERIFY_EXPR(SampleCount == 0 || SampleCount == m_pBoundDepthStencil->GetTexture()->GetDesc().SampleCount);
        SampleCount = m_pBoundDepthStencil->GetTexture()->GetDesc().SampleCount;
        ss << GetTextureFormatAttribs(m_pBoundDepthStencil->GetDesc().Format).Name;
        if (m_pBoundDepthStencil->GetDesc().ViewType == TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL)
            ss << " (read-only)";
    }
    else
        ss << "<Not set>";
    ss << "; Sample count: " << SampleCount;

    if (m_pBoundShadingRateMap)
        ss << "; VRS";

    ss << "\n    PSO: render targets (" << Uint32{GrPipeline.NumRenderTargets} << "): ";
    for (Uint32 rt = 0; rt < GrPipeline.NumRenderTargets; ++rt)
        ss << ' ' << GetTextureFormatAttribs(GrPipeline.RTVFormats[rt]).Name;
    ss << "; DSV: " << GetTextureFormatAttribs(GrPipeline.DSVFormat).Name;
    if (GrPipeline.ReadOnlyDSV)
        ss << " (read-only)";
    ss << "; Sample count: " << Uint32{GrPipeline.SmplDesc.Count};

    if (GrPipeline.ShadingRateFlags & PIPELINE_SHADING_RATE_FLAG_TEXTURE_BASED)
        ss << "; VRS";

    LOG_ERROR_MESSAGE(ss.str());
}